

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalDelete,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::DataTable&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,unsigned_long&,unsigned_long&,bool&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,TableCatalogEntry *args_1,
          DataTable *args_2,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *args_3,unsigned_long *args_4,unsigned_long *args_5,bool *args_6)

{
  pointer *pprVar1;
  iterator __position;
  PhysicalDelete *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_70;
  DataTable *local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_48;
  
  local_68 = args_2;
  this_00 = (PhysicalDelete *)ArenaAllocator::AllocateAligned(&this->arena,0xb8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_3->
       super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_3->
       super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_3->
       super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_3->
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_3->
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_3->
  super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalDelete::PhysicalDelete
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_60,args_1,local_68,
             (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
              *)&local_48,*args_4,*args_5,*args_6);
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_70);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}